

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FileDescriptor * __thiscall
google::protobuf::FileDescriptor::dependency(FileDescriptor *this,int index)

{
  FileDescriptor *local_20;
  int local_14;
  FileDescriptor *pFStack_10;
  int index_local;
  FileDescriptor *this_local;
  
  local_14 = index;
  if (*(long *)(this + 0x18) != 0) {
    local_20 = this;
    pFStack_10 = this;
    internal::
    call_once<std::once_flag&,void(&)(google::protobuf::FileDescriptor_const*),google::protobuf::FileDescriptor_const*>
              (*(once_flag **)(this + 0x18),DependenciesOnceInit,&local_20);
  }
  return *(FileDescriptor **)(*(long *)(this + 0x40) + (long)local_14 * 8);
}

Assistant:

const FileDescriptor* FileDescriptor::dependency(int index) const {
  if (dependencies_once_) {
    // Do once init for all indices, as it's unlikely only a single index would
    // be called, and saves on internal::call_once allocations.
    internal::call_once(dependencies_once_->once,
                        FileDescriptor::DependenciesOnceInit, this);
  }
  return dependencies_[index];
}